

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_TestShell::createTest
          (TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_TestShell *this)

{
  TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test *this_00;
  
  this_00 = (TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test *)
            operator_new(0x58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MemoryReporterPluginTest.cpp"
                         ,0xd4);
  TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test::
  TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryReporterPlugin, newArrayAllocationsAreReportedTest)
{
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getNewArrayAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getNewArrayAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentNewArrayAllocator()->allocMemoryLeakNode(100);
    getCurrentNewArrayAllocator()->free_memory(memory, 100, "unknown", 1);
}